

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::TypePrinter::print::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *prefix,Type type)

{
  TypePrinter *this_00;
  Type type_00;
  bool bVar1;
  ostream *poVar2;
  Type *pTVar3;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  char *prefix_local;
  anon_class_8_1_8991fb9c *this_local;
  Type type_local;
  
  this_00 = this->this;
  this_local = (anon_class_8_1_8991fb9c *)type.id;
  poVar2 = std::operator<<(this_00->os,'(');
  std::operator<<(poVar2,prefix);
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::begin((Type *)&this_local);
  _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::end((Type *)&this_local);
  while( true ) {
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
    if (!bVar1) break;
    pTVar3 = wasm::Type::Iterator::operator*
                       ((Iterator *)
                        &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                         index);
    type_00.id = pTVar3->id;
    std::operator<<(this_00->os,' ');
    TypePrinter::print(this_00,type_00);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  }
  std::operator<<(this_00->os,')');
  return;
}

Assistant:

std::ostream& TypePrinter::print(const Signature& sig) {
  auto printPrefixed = [&](const char* prefix, Type type) {
    os << '(' << prefix;
    for (Type t : type) {
      os << ' ';
      print(t);
    }
    os << ')';
  };

  os << "(func";
  if (sig.params.getID() != Type::none) {
    os << ' ';
    printPrefixed("param", sig.params);
  }
  if (sig.results.getID() != Type::none) {
    os << ' ';
    printPrefixed("result", sig.results);
  }
  return os << ')';
}